

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

Activation * __thiscall
notch::io::PlainTextNetworkReader::getActivation(PlainTextNetworkReader *this,string *tag)

{
  bool bVar1;
  string *tag_local;
  PlainTextNetworkReader *this_local;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tag,
                          "tanh");
  if (bVar1) {
    this_local = (PlainTextNetworkReader *)core::defaultTanh;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tag
                            ,"scaledTanh");
    if (bVar1) {
      this_local = (PlainTextNetworkReader *)core::scaledTanh;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              tag,"linear");
      if (bVar1) {
        this_local = (PlainTextNetworkReader *)core::linearActivation;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )tag,"ReLU");
        if (bVar1) {
          this_local = (PlainTextNetworkReader *)core::ReLU;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)tag,"leakyReLU");
          if (bVar1) {
            this_local = (PlainTextNetworkReader *)core::leakyReLU;
          }
          else {
            this_local = (PlainTextNetworkReader *)0x0;
          }
        }
      }
    }
  }
  return (Activation *)this_local;
}

Assistant:

const Activation *getActivation(const std::string &tag) {
        if (tag == "tanh") {
            return &defaultTanh;
        } else if (tag == "scaledTanh") {
            return &scaledTanh;
        } else if (tag == "linear") {
            return &linearActivation;
        } else if (tag == "ReLU") {
            return &ReLU;
        } else if (tag == "leakyReLU") {
            return &leakyReLU;
        }  else {
            return nullptr;
        }
    }